

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

KeyValue * __thiscall duckdb_parquet::KeyValue::operator=(KeyValue *this,KeyValue *other90)

{
  long in_RSI;
  KeyValue *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI->key,(string *)(in_RSI + 8));
  std::__cxx11::string::operator=((string *)&in_RDI->value,(string *)(in_RSI + 0x28));
  in_RDI->__isset = *(_KeyValue__isset *)(in_RSI + 0x48);
  return in_RDI;
}

Assistant:

KeyValue& KeyValue::operator=(const KeyValue& other90) {
  key = other90.key;
  value = other90.value;
  __isset = other90.__isset;
  return *this;
}